

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  bool bVar1;
  ImGuiWindowTempData *lhs;
  bool local_6a;
  bool local_69;
  bool pressed;
  bool held;
  ImVec2 IStack_68;
  bool hovered;
  undefined1 local_60 [8];
  ImRect bb;
  ImVec2 local_44;
  ImVec2 size;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiButtonFlags flags_local;
  ImVec2 *size_arg_local;
  char *str_id_local;
  
  register0x00000000 = GetCurrentWindow();
  if ((register0x00000000->SkipItems & 1U) == 0) {
    bVar1 = false;
    if ((size_arg->x != 0.0) || (NAN(size_arg->x))) {
      bVar1 = size_arg->y != 0.0;
    }
    if (!bVar1) {
      __assert_fail("size_arg.x != 0.0f && size_arg.y != 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                    ,0x2e5,
                    "bool ImGui::InvisibleButton(const char *, const ImVec2 &, ImGuiButtonFlags)");
    }
    size.x = (float)ImGuiWindow::GetID(register0x00000000,str_id,(char *)0x0);
    bb.Max = *size_arg;
    local_44 = CalcItemSize(bb.Max,0.0,0.0);
    lhs = &stack0xffffffffffffffc8->DC;
    IStack_68 = ::operator+(&lhs->CursorPos,&local_44);
    ImRect::ImRect((ImRect *)local_60,&lhs->CursorPos,&stack0xffffffffffffff98);
    ItemSize(&local_44,-1.0);
    bVar1 = ItemAdd((ImRect *)local_60,(ImGuiID)size.x,(ImRect *)0x0,0);
    if (bVar1) {
      str_id_local._7_1_ =
           ButtonBehavior((ImRect *)local_60,(ImGuiID)size.x,&local_69,&local_6a,flags);
    }
    else {
      str_id_local._7_1_ = false;
    }
  }
  else {
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

bool ImGui::InvisibleButton(const char* str_id, const ImVec2& size_arg, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    // Cannot use zero-size for InvisibleButton(). Unlike Button() there is not way to fallback using the label size.
    IM_ASSERT(size_arg.x != 0.0f && size_arg.y != 0.0f);

    const ImGuiID id = window->GetID(str_id);
    ImVec2 size = CalcItemSize(size_arg, 0.0f, 0.0f);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(size);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, str_id, g.LastItemData.StatusFlags);
    return pressed;
}